

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_firstIndexOf
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  ulong uVar1;
  shared_ptr<Instance> *psVar2;
  int value;
  bool bVar3;
  size_type sVar4;
  undefined8 *puVar5;
  InstanceIsEqualToComparator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  iterator it;
  shared_ptr<Instance> instance;
  IntegerInstance *in_stack_fffffffffffffef8;
  shared_ptr<Instance> *in_stack_ffffffffffffff00;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  allocator local_c9 [5];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_30 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar4 != 1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  this_00 = (InstanceIsEqualToComparator *)(in_RSI + 0x58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_30[0]._M_current =
       (shared_ptr<Instance> *)
       std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                 ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                  in_stack_fffffffffffffef8);
  do {
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
              ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
               in_stack_fffffffffffffef8);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar3) {
      paVar6 = local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"-1",paVar6);
      std::allocator<char>::~allocator((allocator<char> *)local_c9);
LAB_001bf346:
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bf353);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
    ::operator*(local_30);
    in_stack_ffffffffffffff0f =
         InstanceIsEqualToComparator::operator()
                   (this_00,(shared_ptr<Instance> *)
                            CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                    in_stack_ffffffffffffff00);
    if ((bool)in_stack_ffffffffffffff0f) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 in_stack_fffffffffffffef8);
      __gnu_cxx::operator-
                ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_ffffffffffffff00,
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_fffffffffffffef8);
      psVar2 = stack0xffffffffffffff38;
      uVar1 = (ulong)stack0xffffffffffffff38 >> 0x20;
      value = (int)uVar1;
      unique0x10000296 = psVar2;
      IntegerInstance::IntegerInstance
                ((IntegerInstance *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 value);
      IntegerInstance::representation_abi_cxx11_(in_stack_fffffffffffffef8);
      IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bf287);
      goto LAB_001bf346;
    }
    register0x00000000 =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
         ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                      (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  } while( true );
}

Assistant:

std::string VectorInstance::op_firstIndexOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}